

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGenericCustomSection
          (BinaryReader *this,string_view name,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Offset size;
  Offset custom_data_size;
  void *data;
  Offset local_30;
  Offset section_size_local;
  BinaryReader *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReader *)name._M_len;
  local_30 = section_size;
  section_size_local = (Offset)this;
  data._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])(this->delegate_,section_size);
  bVar1 = Succeeded(data._4_4_);
  if (bVar1) {
    size = this->read_end_ - (this->state_).offset;
    RVar2 = ReadBytesWithSize(this,(void **)&custom_data_size,size,"custom section data");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&name_local._M_str + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[199])
                              (this->delegate_,this_local,name_local._M_len,custom_data_size,size);
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[200])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
        }
        else {
          PrintError(this,"EndGenericCustomSection callback failed");
          Result::Result((Result *)((long)&name_local._M_str + 4),Error);
        }
      }
      else {
        PrintError(this,"OnGenericCustomSection callback failed");
        Result::Result((Result *)((long)&name_local._M_str + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginGenericCustomSection callback failed");
    Result::Result((Result *)((long)&name_local._M_str + 4),Error);
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReader::ReadGenericCustomSection(std::string_view name,
                                              Offset section_size) {
  CALLBACK(BeginGenericCustomSection, section_size);
  const void* data;
  Offset custom_data_size = read_end_ - state_.offset;
  CHECK_RESULT(
      ReadBytesWithSize(&data, custom_data_size, "custom section data"));
  CALLBACK(OnGenericCustomSection, name, data, custom_data_size);
  CALLBACK0(EndGenericCustomSection);
  return Result::Ok;
}